

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t Array_calcSizeBinary(void *src,size_t length,UA_DataType *type)

{
  size_t sVar1;
  uint local_4c;
  ulong local_48;
  size_t i;
  size_t encode_index;
  uintptr_t ptr;
  size_t s;
  UA_DataType *type_local;
  size_t length_local;
  void *src_local;
  
  ptr = 4;
  if (((byte)type->field_0x25 >> 2 & 1) == 0) {
    if ((type->field_0x25 & 1) == 0) {
      local_4c = 0x19;
    }
    else {
      local_4c = (uint)type->typeIndex;
    }
    encode_index = (size_t)src;
    for (local_48 = 0; local_48 < length; local_48 = local_48 + 1) {
      sVar1 = (*calcSizeBinaryJumpTable[local_4c])((void *)encode_index,type);
      ptr = sVar1 + ptr;
      encode_index = type->memSize + encode_index;
    }
    src_local = (void *)ptr;
  }
  else {
    src_local = (void *)(type->memSize * length + 4);
  }
  return (size_t)src_local;
}

Assistant:

static size_t
Array_calcSizeBinary(const void *src, size_t length, const UA_DataType *type) {
    size_t s = 4; // length
    if(type->overlayable) {
        s += type->memSize * length;
        return s;
    }
    uintptr_t ptr = (uintptr_t)src;
    size_t encode_index = type->builtin ? type->typeIndex : UA_BUILTIN_TYPES_COUNT;
    for(size_t i = 0; i < length; ++i) {
        s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, type);
        ptr += type->memSize;
    }
    return s;
}